

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::restoreSimplifiedConstraints
          (QGraphicsAnchorLayoutPrivate *this,ParallelAnchorData *parallel)

{
  QSimplexVariable *pQVar1;
  QSimplexConstraint *pQVar2;
  AnchorVertex *pAVar3;
  AnchorVertex *pAVar4;
  double *pdVar5;
  int i;
  ulong uVar6;
  long in_FS_OFFSET;
  qreal v;
  QSimplexVariable *local_48;
  QSimplexVariable *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((parallel->super_AnchorData).field_0x78 & 8) != 0) {
    pQVar1 = &(parallel->super_AnchorData).super_QSimplexVariable;
    for (uVar6 = 0; uVar6 < (ulong)(parallel->m_firstConstraints).d.size; uVar6 = uVar6 + 1) {
      pQVar2 = (parallel->m_firstConstraints).d.ptr[uVar6];
      local_40 = pQVar1;
      pdVar5 = QHash<QSimplexVariable_*,_double>::operator[](&pQVar2->variables,&local_40);
      local_40 = (QSimplexVariable *)*pdVar5;
      local_48 = pQVar1;
      QHash<QSimplexVariable*,double>::removeImpl<QSimplexVariable*>
                ((QHash<QSimplexVariable*,double> *)pQVar2,&local_48);
      local_48 = &parallel->firstEdge->super_QSimplexVariable;
      if (parallel->firstEdge == (AnchorData *)0x0) {
        local_48 = (QSimplexVariable *)0x0;
      }
      QHash<QSimplexVariable*,double>::emplace<double_const&>
                ((QHash<QSimplexVariable*,double> *)pQVar2,&local_48,(double *)&local_40);
    }
    pAVar3 = parallel->firstEdge->from;
    pAVar4 = parallel->secondEdge->from;
    for (uVar6 = 0; uVar6 < (ulong)(parallel->m_secondConstraints).d.size; uVar6 = uVar6 + 1) {
      pQVar2 = (parallel->m_secondConstraints).d.ptr[uVar6];
      local_40 = pQVar1;
      pdVar5 = QHash<QSimplexVariable_*,_double>::operator[](&pQVar2->variables,&local_40);
      local_40 = (QSimplexVariable *)*pdVar5;
      if (pAVar3 != pAVar4) {
        local_40 = (QSimplexVariable *)((ulong)local_40 ^ 0x8000000000000000);
      }
      local_48 = pQVar1;
      QHash<QSimplexVariable*,double>::removeImpl<QSimplexVariable*>
                ((QHash<QSimplexVariable*,double> *)pQVar2,&local_48);
      local_48 = &parallel->secondEdge->super_QSimplexVariable;
      if (parallel->secondEdge == (AnchorData *)0x0) {
        local_48 = (QSimplexVariable *)0x0;
      }
      QHash<QSimplexVariable*,double>::emplace<double_const&>
                ((QHash<QSimplexVariable*,double> *)pQVar2,&local_48,(double *)&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::restoreSimplifiedConstraints(ParallelAnchorData *parallel)
{
    if (!parallel->isCenterAnchor)
        return;

    for (int i = 0; i < parallel->m_firstConstraints.size(); ++i) {
        QSimplexConstraint *c = parallel->m_firstConstraints.at(i);
        qreal v = c->variables[parallel];
        c->variables.remove(parallel);
        c->variables.insert(parallel->firstEdge, v);
    }

    // When restoring, we might have to revert constraints back. See comments on
    // addAnchorMaybeParallel().
    const bool needsReverse = !parallel->secondForward();

    for (int i = 0; i < parallel->m_secondConstraints.size(); ++i) {
        QSimplexConstraint *c = parallel->m_secondConstraints.at(i);
        qreal v = c->variables[parallel];
        if (needsReverse)
            v *= -1;
        c->variables.remove(parallel);
        c->variables.insert(parallel->secondEdge, v);
    }
}